

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_mask_pred_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ab78d::AV1UpsampledPredTest_CheckOutput_Test::TestBody
          (AV1UpsampledPredTest_CheckOutput_Test *this)

{
  BLOCK_SIZE_conflict in_stack_000000b7;
  upsampled_pred_func in_stack_000000b8;
  AV1UpsampledPredTest *in_stack_000000c0;
  
  testing::
  WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::
  get<0ul,void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
              *)0xaad2cf);
  testing::
  WithParamInterface<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
  ::GetParam();
  std::
  get<1ul,void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int),BLOCK_SIZE>
            ((tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>
              *)0xaad2e4);
  AV1UpsampledPredTest::RunCheckOutput(in_stack_000000c0,in_stack_000000b8,in_stack_000000b7);
  return;
}

Assistant:

TEST_P(AV1UpsampledPredTest, CheckOutput) {
  RunCheckOutput(GET_PARAM(0), GET_PARAM(1));
}